

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprLexer.cxx
# Opt level: O1

YY_BUFFER_STATE cmExpr_yy_scan_bytes(char *yybytes,int _yybytes_len,yyscan_t yyscanner)

{
  char *base;
  YY_BUFFER_STATE pyVar1;
  undefined4 in_register_00000034;
  yyscan_t yyscanner_00;
  yyscan_t yyscanner_01;
  
  yyscanner_00 = (yyscan_t)CONCAT44(in_register_00000034,_yybytes_len);
  yyscanner_01 = (yyscan_t)(long)(_yybytes_len + 2);
  base = (char *)malloc((size_t)yyscanner_01);
  if (base == (char *)0x0) {
    yy_fatal_error("out of dynamic memory in yy_scan_bytes()",yyscanner_00);
  }
  if (0 < _yybytes_len) {
    memcpy(base,yybytes,(ulong)(uint)_yybytes_len);
  }
  (base + _yybytes_len)[0] = '\0';
  (base + _yybytes_len)[1] = '\0';
  pyVar1 = cmExpr_yy_scan_buffer(base,(yy_size_t)yyscanner_01,yyscanner);
  if (pyVar1 != (YY_BUFFER_STATE)0x0) {
    pyVar1->yy_is_our_buffer = 1;
    return pyVar1;
  }
  yy_fatal_error("bad buffer in yy_scan_bytes()",yyscanner_01);
}

Assistant:

YY_BUFFER_STATE yy_scan_bytes  (const char * yybytes, int  _yybytes_len , yyscan_t yyscanner)
{
	YY_BUFFER_STATE b;
	char *buf;
	yy_size_t n;
	int i;

	/* Get memory for full buffer, including space for trailing EOB's. */
	n = (yy_size_t) (_yybytes_len + 2);
	buf = (char *) yyalloc( n , yyscanner );
	if ( ! buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_scan_bytes()" );

	for ( i = 0; i < _yybytes_len; ++i )
		buf[i] = yybytes[i];

	buf[_yybytes_len] = buf[_yybytes_len+1] = YY_END_OF_BUFFER_CHAR;

	b = yy_scan_buffer( buf, n , yyscanner);
	if ( ! b )
		YY_FATAL_ERROR( "bad buffer in yy_scan_bytes()" );

	/* It's okay to grow etc. this buffer, and we should throw it
	 * away when we're done.
	 */
	b->yy_is_our_buffer = 1;

	return b;
}